

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

XmlWriter * __thiscall Catch::XmlWriter::endElement(XmlWriter *this)

{
  string *this_00;
  ostream *poVar1;
  string asStack_38 [32];
  
  newlineIfNecessary(this);
  this_00 = &this->m_indent;
  std::__cxx11::string::substr((ulong)asStack_38,(ulong)this_00);
  std::__cxx11::string::operator=((string *)this_00,asStack_38);
  std::__cxx11::string::~string(asStack_38);
  if (this->m_tagIsOpen == true) {
    std::operator<<((ostream *)this->m_os,"/>");
    this->m_tagIsOpen = false;
  }
  else {
    poVar1 = std::operator<<((ostream *)this->m_os,(string *)this_00);
    poVar1 = std::operator<<(poVar1,"</");
    poVar1 = std::operator<<(poVar1,(string *)
                                    ((this->m_tags).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + -1));
    std::operator<<(poVar1,">");
  }
  std::endl<char,std::char_traits<char>>((ostream *)this->m_os);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(&this->m_tags);
  return this;
}

Assistant:

XmlWriter& XmlWriter::endElement() {
        newlineIfNecessary();
        m_indent = m_indent.substr( 0, m_indent.size()-2 );
        if( m_tagIsOpen ) {
            m_os << "/>";
            m_tagIsOpen = false;
        }
        else {
            m_os << m_indent << "</" << m_tags.back() << ">";
        }
        m_os << std::endl;
        m_tags.pop_back();
        return *this;
    }